

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O0

QString * __thiscall
ExportDirWrapper::getFieldName
          (QString *__return_storage_ptr__,ExportDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  PEFile *local_58;
  PEFile *myPe;
  size_t fieldId_local;
  ExportDirWrapper *this_local;
  
  switch(fieldId) {
  case 0:
    QString::QString(__return_storage_ptr__,"Characteristics");
    break;
  case 1:
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    if (pEVar1 == (Executable *)0x0) {
      local_58 = (PEFile *)0x0;
    }
    else {
      local_58 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0);
    }
    if ((local_58 == (PEFile *)0x0) || (bVar2 = PEFile::isReproBuild(local_58), !bVar2)) {
      QString::QString(__return_storage_ptr__,"TimeDateStamp");
    }
    else {
      QString::QString(__return_storage_ptr__,"ReproChecksum");
    }
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"MajorVersion");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"MinorVersion");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"Name");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"Base");
    break;
  case 6:
    QString::QString(__return_storage_ptr__,"NumberOfFunctions");
    break;
  case 7:
    QString::QString(__return_storage_ptr__,"NumberOfNames");
    break;
  case 8:
    QString::QString(__return_storage_ptr__,"AddressOfFunctions");
    break;
  case 9:
    QString::QString(__return_storage_ptr__,"AddressOfNames");
    break;
  case 10:
    QString::QString(__return_storage_ptr__,"AddressOfNameOrdinals");
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return "TimeDateStamp";
        }
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case NAME_RVA: return "Name";
        case BASE: return "Base";
        case FUNCTIONS_NUM: return "NumberOfFunctions";
        case NAMES_NUM: return "NumberOfNames";
        case FUNCTIONS_RVA: return "AddressOfFunctions";
        case FUNC_NAMES_RVA: return "AddressOfNames";
        case NAMES_ORDINALS_RVA: return "AddressOfNameOrdinals";
    }
    return getName();
}